

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-lex.c
# Opt level: O0

int ztlex_ishex(ztlex_t *lex)

{
  int iVar1;
  ushort **ppuVar2;
  long in_RDI;
  int c;
  int i;
  bool local_19;
  int local_18;
  int local_14;
  int local_4;
  
  iVar1 = (**(code **)(in_RDI + 0x238))(in_RDI);
  if (iVar1 == -1) {
    local_4 = -1;
  }
  else if (iVar1 == 0x30) {
    local_14 = 1;
    *(undefined1 *)(in_RDI + 0x128) = 0x30;
    iVar1 = (**(code **)(in_RDI + 0x238))(in_RDI);
    if (iVar1 == 0x78) {
      local_18 = 0x78;
      do {
        iVar1 = local_14 + 1;
        *(char *)(in_RDI + 0x128 + (long)local_14) = (char)local_18;
        local_18 = (**(code **)(in_RDI + 0x238))(in_RDI);
        ppuVar2 = __ctype_b_loc();
        local_19 = ((*ppuVar2)[local_18] & 0x1000) != 0 && iVar1 < 0xff;
        local_14 = iVar1;
      } while (local_19);
      if ((local_18 != -1) && (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[local_18] & 0x1000) == 0)) {
        (**(code **)(in_RDI + 0x240))(local_18,in_RDI);
      }
      if (2 < iVar1) {
        *(undefined1 *)(in_RDI + 0x128 + (long)iVar1) = 0;
        return iVar1;
      }
    }
    else if (iVar1 != -1) {
      (**(code **)(in_RDI + 0x240))(iVar1,in_RDI);
    }
    while (local_14 = local_14 + -1, -1 < local_14) {
      (**(code **)(in_RDI + 0x240))((int)*(char *)(in_RDI + 0x128 + (long)local_14),in_RDI);
    }
    local_4 = 0;
  }
  else {
    (**(code **)(in_RDI + 0x240))(iVar1,in_RDI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ztlex_ishex(ztlex_t *lex)
{
  int i = 0;
  int c;

  c = lex->getC(lex);
  if (c == EOF)
    return EOF;

  if (c != '0')
  {
    lex->ungetC(c, lex);
    return 0;
  }

  lex->lexeme[i++] = c;

  c = lex->getC(lex);
  if (c != 'x') /* including EOF */
  {
    if (c != EOF)
      lex->ungetC(c, lex);
    goto undo;
  }

  do
  {
    lex->lexeme[i++] = c;
    c = lex->getC(lex);
  }
  while (isxdigit(c) && i < MAXLEXEME - 1);

  if (c != EOF && !isxdigit(c))
    lex->ungetC(c, lex);

  if (i < 3)
  {
undo:
    while (--i >= 0)
      lex->ungetC(lex->lexeme[i], lex);
    return 0;
  }

  lex->lexeme[i] = '\0';
  return i;
}